

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O1

void avro::codec_traits<boost::array<unsigned_char,_16UL>_>::decode
               (Decoder *d,array<unsigned_char,_16UL> *s)

{
  undefined8 uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  undefined8 *local_38;
  undefined8 *puStack_30;
  undefined8 *local_28;
  
  local_38 = (undefined8 *)0x0;
  puStack_30 = (undefined8 *)0x0;
  local_28 = (undefined8 *)0x0;
  local_38 = (undefined8 *)operator_new(0x10);
  puStack_30 = local_38 + 2;
  *local_38 = 0;
  local_38[1] = 0;
  local_28 = puStack_30;
  (*d->_vptr_Decoder[0xd])(d,0x10,&local_38);
  uVar1 = local_38[1];
  *(undefined8 *)s->elems = *local_38;
  *(undefined8 *)(s->elems + 8) = uVar1;
  if (local_38 != (undefined8 *)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return;
}

Assistant:

static void decode(Decoder& d, boost::array<uint8_t, N>& s) {
        std::vector<uint8_t> v(N);
        d.decodeFixed(N, v);
        std::copy(&v[0], &v[0] + N, &s[0]);
    }